

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

QRegularExpressionMatchIterator __thiscall
QRegularExpression::globalMatch
          (QRegularExpression *this,QString *subject,qsizetype offset,MatchType matchType,
          MatchOptions matchOptions)

{
  qsizetype in_RCX;
  QString *in_RDX;
  QRegularExpression *in_RSI;
  QRegularExpressionMatchIteratorPrivate *in_RDI;
  MatchType in_R8D;
  long in_FS_OFFSET;
  QRegularExpressionMatchIteratorPrivate *priv;
  QRegularExpressionMatchIteratorPrivate *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  MatchType in_stack_ffffffffffffff74;
  QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate> this_00;
  QFlagsStorage<QRegularExpression::MatchOption> matchOptions_00;
  QRegularExpression *this_01;
  long lVar1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00.d.ptr =
       (totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>)
       (totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>)in_RDI;
  this_01 = in_RSI;
  operator_new(0x20);
  matchOptions_00.i = (Int)((ulong)in_RSI >> 0x20);
  match(this_01,in_RDX,in_RCX,in_R8D,
        (QFlagsStorageHelper<QRegularExpression::MatchOption,_4>)SUB84((ulong)lVar1 >> 0x20,0));
  QRegularExpressionMatchIteratorPrivate::QRegularExpressionMatchIteratorPrivate
            ((QRegularExpressionMatchIteratorPrivate *)this_00.d.ptr,(QRegularExpression *)in_RDI,
             in_stack_ffffffffffffff74,(MatchOptions)matchOptions_00.i,
             (QRegularExpressionMatch *)in_stack_ffffffffffffff68);
  QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)0x72e3d7);
  QRegularExpressionMatchIterator::QRegularExpressionMatchIterator
            ((QRegularExpressionMatchIterator *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
            );
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)
           (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)this_00.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QRegularExpressionMatchIterator QRegularExpression::globalMatch(const QString &subject,
                                                                qsizetype offset,
                                                                MatchType matchType,
                                                                MatchOptions matchOptions) const
{
    QRegularExpressionMatchIteratorPrivate *priv =
            new QRegularExpressionMatchIteratorPrivate(*this,
                                                       matchType,
                                                       matchOptions,
                                                       match(subject, offset, matchType, matchOptions));

    return QRegularExpressionMatchIterator(*priv);
}